

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

string * Test::Private::getFileName(string *__return_storage_ptr__,string *file)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_type local_28;
  size_t pos;
  string *local_18;
  string *file_local;
  string *fileName;
  
  pos._7_1_ = 0;
  local_18 = file;
  file_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,file);
  local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_last_of(__return_storage_ptr__,'\\',0xffffffffffffffff);
  if (local_28 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_48,__return_storage_ptr__,local_28 + 1,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  local_28 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_last_of(__return_storage_ptr__,'/',0xffffffffffffffff);
  if (local_28 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_78,__return_storage_ptr__,local_28 + 1,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Private::getFileName(const std::string &file) {
  std::string fileName = file;
  std::size_t pos = fileName.find_last_of('\\');
  if (pos != std::string::npos)
    fileName = fileName.substr(pos + 1);
  pos = fileName.find_last_of('/');
  if (pos != std::string::npos)
    fileName = fileName.substr(pos + 1);
  return fileName;
}